

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError
ValidateChunk(WebPMux *mux,CHUNK_INDEX idx,WebPFeatureFlags feature,uint32_t vp8x_flags,int max,
             int *num)

{
  int iVar1;
  WebPChunkId in_ECX;
  WebPChunkId in_EDX;
  undefined4 in_ESI;
  int in_R8D;
  int *in_R9;
  WebPMuxError err;
  WebPMuxError local_4;
  
  local_4 = WebPMuxNumChunks((WebPMux *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R9);
  if (local_4 == WEBP_MUX_OK) {
    if ((in_R8D < 0) || (*in_R9 <= in_R8D)) {
      if ((in_EDX == WEBP_CHUNK_VP8X) ||
         (iVar1 = IsNotCompatible(in_ECX & in_EDX,*in_R9), iVar1 == 0)) {
        local_4 = WEBP_MUX_OK;
      }
      else {
        local_4 = WEBP_MUX_INVALID_ARGUMENT;
      }
    }
    else {
      local_4 = WEBP_MUX_INVALID_ARGUMENT;
    }
  }
  return local_4;
}

Assistant:

static WebPMuxError ValidateChunk(const WebPMux* const mux, CHUNK_INDEX idx,
                                  WebPFeatureFlags feature,
                                  uint32_t vp8x_flags,
                                  int max, int* num) {
  const WebPMuxError err =
      WebPMuxNumChunks(mux, kChunks[idx].id, num);
  if (err != WEBP_MUX_OK) return err;
  if (max > -1 && *num > max) return WEBP_MUX_INVALID_ARGUMENT;
  if (feature != NO_FLAG && IsNotCompatible(vp8x_flags & feature, *num)) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  return WEBP_MUX_OK;
}